

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O1

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrLocalizationMapQueryInfoBaseHeaderML *value)

{
  InvalidStructureType
            (instance_info,command_name,objects_info,"XrLocalizationMapQueryInfoBaseHeaderML",
             value->type,"VUID-XrLocalizationMapQueryInfoBaseHeaderML-type-type",XR_TYPE_UNKNOWN,"")
  ;
  return XR_ERROR_VALIDATION_FAILURE;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrLocalizationMapQueryInfoBaseHeaderML* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // NOTE: Can't validate "VUID-XrLocalizationMapQueryInfoBaseHeaderML-type-parameter" because it is a base structure
    // NOTE: Can't validate "VUID-XrLocalizationMapQueryInfoBaseHeaderML-next-next" because it is a base structure
    InvalidStructureType(instance_info, command_name, objects_info, "XrLocalizationMapQueryInfoBaseHeaderML",
                         value->type, "VUID-XrLocalizationMapQueryInfoBaseHeaderML-type-type");
    return XR_ERROR_VALIDATION_FAILURE;
}